

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

wstring * __thiscall
mjs::token_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,token_type t)

{
  bool bVar1;
  wostringstream local_190 [8];
  wostringstream woss;
  token_type t_local;
  
  bVar1 = is_literal((token_type)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_literal(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x27,"std::wstring mjs::token_string(token_type)");
  }
  std::__cxx11::wostringstream::wostringstream(local_190);
  operator<<((wostream *)local_190,(token_type)this);
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::wstring token_string(token_type t) {
    assert(!is_literal(t));
    std::wostringstream woss;
    woss << t;
    return woss.str();
}